

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O2

void userLoop(Simulator *sim)

{
  int iVar1;
  Timer *pTVar2;
  uint uVar3;
  int iVar4;
  MySimulator *this;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Timer *pTVar8;
  uint uVar9;
  Timer *pTVar10;
  
  this = (MySimulator *)
         __dynamic_cast(sim,&brown::Simulator::typeinfo,&brown::MySimulator::typeinfo,0);
  if (((this != (MySimulator *)0x0) && (r1step < 1)) && (r2step < 1)) {
    if (0x294 < userLoop::ptIdx) {
      brown::MySimulator::delay(this,0);
      return;
    }
    if (userLoop::ptIdx == 0) {
      userLoop::ptIdx = 0;
    }
    else {
      brown::MySimulator::delay(this,(long)sim->MAXT);
    }
    iVar5 = (int)(state[userLoop::ptIdx][1] / 8);
    iVar4 = (int)(state[userLoop::ptIdx][2] / 8);
    uVar6 = iVar5 - _ZZL8userLoopRN5brown9SimulatorEE4locs_0;
    uVar9 = iVar4 - _ZZL8userLoopRN5brown9SimulatorEE4locs_1;
    if (uVar9 != 0 || uVar6 != 0) {
      this->dirx = 0 < (int)uVar6;
      this->diry = 0 < (int)uVar9;
      this->isDown = state[userLoop::ptIdx][0] != 0;
      uVar3 = -uVar6;
      if (0 < (int)uVar6) {
        uVar3 = uVar6;
      }
      uVar6 = -uVar9;
      if (0 < (int)uVar9) {
        uVar6 = uVar9;
      }
      isxmain = uVar6 < uVar3;
      uVar9 = uVar6;
      if (uVar6 < uVar3) {
        uVar9 = uVar3;
      }
      uVar7 = uVar6;
      if (uVar3 < uVar6) {
        uVar7 = uVar3;
      }
      iVar1 = (this->super_Simulator).PULPERPIX;
      r1step = uVar9 * iVar1;
      r2step = iVar1 * uVar7;
      if (uVar7 == 0) {
        tg = -1.0;
      }
      else {
        tg = (float)r1step / (float)r2step;
      }
      pTVar8 = this->timx;
      pTVar2 = this->timy;
      pTVar10 = pTVar2;
      if (uVar6 < uVar3) {
        pTVar10 = pTVar8;
      }
      pTVar10->period = 0;
      pTVar10->isRunning = true;
      if (uVar7 != 0) {
        if (uVar6 < uVar3) {
          pTVar8 = pTVar2;
        }
        pTVar8->period = 0;
        pTVar8->isRunning = true;
      }
    }
    userLoop::ptIdx = userLoop::ptIdx + 1;
    _ZZL8userLoopRN5brown9SimulatorEE4locs_0 = iVar5;
    _ZZL8userLoopRN5brown9SimulatorEE4locs_1 = iVar4;
  }
  return;
}

Assistant:

static void userLoop(brown::Simulator& sim) {
    auto* psim = dynamic_cast<brown::MySimulator*>(&sim);
    if (!psim) {return;}
    brown::MySimulator& msim = *psim;

    // return if still drawing
    if (r1step > 0 || r2step > 0) {
        return;
    }

    // drawing finished, do nothing
    static constexpr std::size_t ptNum = sizeof(state)/sizeof(state[0]);
    static std::size_t ptIdx = 0;
    if (ptIdx >= ptNum) {
        msim.delay(0);
        return;
    }

    // delay between lines
    if (ptIdx > 0) {
        msim.delay(sim.MAXT);
    }

    // target location [px]
    static int scale = 8;
    int x = state[ptIdx][1]/scale;
    int y = state[ptIdx][2]/scale;
    bool isDown = static_cast<bool>(state[ptIdx][0]);

    // relative linear motion
    static int locs[2]{0, 0};
    int dx = x - locs[0];
    int dy = y - locs[1];
    moveLinear(msim, dx, dy, isDown);

    // update meta
    locs[0] = x; locs[1] = y;
    ptIdx++;
}